

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIf.c
# Opt level: O3

int Gia_ManLutLevel(Gia_Man_t *p,int **ppLevels)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  Vec_Int_t *pVVar5;
  int *piVar6;
  uint uVar7;
  int *__ptr;
  ulong uVar8;
  size_t sVar9;
  long lVar10;
  int iVar11;
  ulong uVar12;
  size_t __nmemb;
  
  iVar1 = p->nObjs;
  __nmemb = (size_t)iVar1;
  __ptr = (int *)calloc(__nmemb,4);
  if (1 < (long)__nmemb) {
    pVVar5 = p->vMapping;
    uVar2 = pVVar5->nSize;
    sVar9 = 1;
    do {
      if ((long)(int)uVar2 <= (long)sVar9) {
LAB_0020b1f2:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      piVar6 = pVVar5->pArray;
      uVar3 = piVar6[sVar9];
      uVar8 = (ulong)uVar3;
      if (uVar8 != 0) {
        if (((int)uVar3 < 0) || (uVar2 <= uVar3)) goto LAB_0020b1f2;
        uVar3 = piVar6[uVar8];
        uVar7 = uVar3;
        if ((int)uVar3 < 1) {
          uVar7 = 0;
        }
        if ((int)uVar3 < 1) {
          iVar11 = 1;
        }
        else {
          iVar11 = 0;
          uVar12 = 0;
          do {
            iVar4 = __ptr[piVar6[uVar8 + uVar12 + 1]];
            if (__ptr[piVar6[uVar8 + uVar12 + 1]] < iVar11) {
              iVar4 = iVar11;
            }
            iVar11 = iVar4;
            uVar12 = uVar12 + 1;
          } while (uVar7 != uVar12);
          iVar11 = iVar11 + 1;
        }
        __ptr[sVar9] = iVar11;
      }
      sVar9 = sVar9 + 1;
    } while (sVar9 != __nmemb);
  }
  uVar8 = (ulong)p->vCos->nSize;
  if ((long)uVar8 < 1) {
    iVar11 = 0;
  }
  else {
    piVar6 = p->vCos->pArray;
    uVar12 = 0;
    iVar11 = 0;
    do {
      iVar4 = piVar6[uVar12];
      lVar10 = (long)iVar4;
      if ((lVar10 < 0) || (iVar1 <= iVar4)) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      iVar4 = __ptr[(int)(iVar4 - (*(uint *)(p->pObjs + lVar10) & 0x1fffffff))];
      if (iVar11 <= iVar4) {
        iVar11 = iVar4;
      }
      __ptr[lVar10] = iVar4;
      uVar12 = uVar12 + 1;
    } while (uVar12 < uVar8);
  }
  if (ppLevels == (int **)0x0) {
    if (__ptr != (int *)0x0) {
      free(__ptr);
    }
  }
  else {
    *ppLevels = __ptr;
  }
  return iVar11;
}

Assistant:

int Gia_ManLutLevel( Gia_Man_t * p, int ** ppLevels )
{
    Gia_Obj_t * pObj;
    int i, k, iFan, Level;
    int * pLevels = ABC_CALLOC( int, Gia_ManObjNum(p) );
    Gia_ManForEachLut( p, i )
    {
        Level = 0;
        Gia_LutForEachFanin( p, i, iFan, k )
            if ( Level < pLevels[iFan] )
                Level = pLevels[iFan];
        pLevels[i] = Level + 1;
    }
    Level = 0;
    Gia_ManForEachCo( p, pObj, k )
    {
        int LevelFan = pLevels[Gia_ObjFaninId0p(p, pObj)];
        Level = Abc_MaxInt( Level, LevelFan );
        pLevels[Gia_ObjId(p, pObj)] = LevelFan;
    }
    if ( ppLevels )
        *ppLevels = pLevels;
    else
        ABC_FREE( pLevels );
    return Level;
}